

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader.c
# Opt level: O0

int yaml_parser_load_alias(yaml_parser_t *parser,yaml_event_t *first_event)

{
  yaml_char_t *__s2;
  int iVar1;
  yaml_alias_data_t *local_30;
  yaml_alias_data_t *alias_data;
  yaml_char_t *anchor;
  yaml_event_t *first_event_local;
  yaml_parser_t *parser_local;
  
  __s2 = (first_event->data).scalar.anchor;
  local_30 = (parser->aliases).start;
  while( true ) {
    if (local_30 == (parser->aliases).top) {
      yaml_free(__s2);
      iVar1 = yaml_parser_set_composer_error(parser,"found undefined alias",first_event->start_mark)
      ;
      return iVar1;
    }
    iVar1 = strcmp((char *)local_30->anchor,(char *)__s2);
    if (iVar1 == 0) break;
    local_30 = local_30 + 1;
  }
  yaml_free(__s2);
  return local_30->index;
}

Assistant:

static int
yaml_parser_load_alias(yaml_parser_t *parser, yaml_event_t *first_event)
{
    yaml_char_t *anchor = first_event->data.alias.anchor;
    yaml_alias_data_t *alias_data;

    for (alias_data = parser->aliases.start;
            alias_data != parser->aliases.top; alias_data ++) {
        if (strcmp((char *)alias_data->anchor, (char *)anchor) == 0) {
            yaml_free(anchor);
            return alias_data->index;
        }
    }

    yaml_free(anchor);
    return yaml_parser_set_composer_error(parser, "found undefined alias",
            first_event->start_mark);
}